

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_InvalidFileRequiredPresence_Test::
~FeaturesTest_InvalidFileRequiredPresence_Test(FeaturesTest_InvalidFileRequiredPresence_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest((ValidationErrorTest *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, InvalidFileRequiredPresence) {
  BuildDescriptorMessagesInTestPool();
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        options { features { field_presence: LEGACY_REQUIRED } }
      )pb",
      "foo.proto: foo.proto: EDITIONS: Required presence can't be specified "
      "by default.\n");
}